

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::GPUShaderFP64Test7::iterate(GPUShaderFP64Test7 *this)

{
  int iVar1;
  _variable_type output_variable_type;
  int iVar2;
  bool bVar3;
  uint uVar4;
  NotSupportedError *pNVar5;
  long lVar6;
  char *pcVar7;
  GPUShaderFP64Test7 *this_00;
  uint uVar8;
  int iVar9;
  _variable new_variable;
  _variables variables_to_test;
  _variable local_1cc;
  long local_1c0;
  undefined1 local_1b8 [8];
  iterator iStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar3) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"GL_ARB_gpu_shader_fp64 is not supported.","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1b8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar7 = "GL_ARB_vertex_attrib_64bit";
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_vertex_attrib_64bit")
  ;
  if (!bVar3) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"GL_ARB_vertex_attrib_64bit is not supported.","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1b8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  lVar6 = 0;
  do {
    output_variable_type = (&DAT_01a7f2a0)[lVar6];
    uVar8 = 1;
    local_1c0 = lVar6;
    do {
      uVar4 = this->m_fs_id;
      getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
                ((string *)local_1b8,(GPUShaderFP64Test7 *)pcVar7,output_variable_type,uVar8);
      this_00 = (GPUShaderFP64Test7 *)(ulong)uVar4;
      bVar3 = compileShader(this,uVar4,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        this_00 = (GPUShaderFP64Test7 *)(local_1a8[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b8,(ulong)this_00);
      }
      if (bVar3) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&iStack_1b0,
                   "A fragment shader with double-precision output variable compiled successfully.",
                   0x4e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_00 = (GPUShaderFP64Test7 *)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
        std::ios_base::~ios_base(local_140);
        this->m_has_test_passed = false;
      }
      uVar4 = this->m_fs_id;
      getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
                ((string *)local_1b8,this_00,output_variable_type,uVar8);
      pcVar7 = (char *)(ulong)uVar4;
      bVar3 = compileShader(this,uVar4,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        pcVar7 = (char *)(local_1a8[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b8,(ulong)pcVar7);
      }
      if (bVar3) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&iStack_1b0,
                   "A fragment shader with double-precision input variables lacking flat layout qualifier compiled successfully."
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        pcVar7 = &std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
        std::ios_base::~ios_base(local_140);
        this->m_has_test_passed = false;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
    lVar6 = local_1c0 + 1;
  } while (lVar6 != 0xd);
  local_1b8 = (undefined1  [8])0x0;
  iStack_1b0._M_current = (_variable *)0x0;
  local_1a8[0]._M_allocated_capacity = (_variable *)0x0;
  uVar8 = 0;
  iVar9 = 0;
LAB_009457c5:
  do {
    if ((iVar9 < this->m_n_max_components_per_stage) && (uVar8 != 0x1a)) {
      local_1cc.array_size = (uVar8 & 1) + 1;
      local_1cc.type = (&DAT_01a7f2a0)[uVar8 >> 1];
      uVar4 = Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(local_1cc.type);
      iVar1 = iVar9 + uVar4 * local_1cc.array_size * 8;
      iVar2 = this->m_n_max_components_per_stage;
      if (iVar2 < iVar1) {
        uVar4 = (uint)(iVar2 < (int)(uVar4 * local_1cc.array_size * 8));
      }
      else {
        iVar9 = iVar1;
        if (iStack_1b0._M_current == (_variable *)local_1a8[0]._0_8_) {
          uVar4 = 1;
          std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,std::allocator<gl4cts::GPUShaderFP64Test7::_variable>>
          ::_M_realloc_insert<gl4cts::GPUShaderFP64Test7::_variable_const&>
                    ((vector<gl4cts::GPUShaderFP64Test7::_variable,std::allocator<gl4cts::GPUShaderFP64Test7::_variable>>
                      *)local_1b8,iStack_1b0,&local_1cc);
        }
        else {
          (iStack_1b0._M_current)->type = local_1cc.type;
          (iStack_1b0._M_current)->attribute_location = local_1cc.attribute_location;
          (iStack_1b0._M_current)->array_size = local_1cc.array_size;
          iStack_1b0._M_current = iStack_1b0._M_current + 1;
          uVar4 = 1;
        }
      }
      uVar8 = uVar8 + uVar4;
      if (iVar1 <= iVar2) goto LAB_009457c5;
    }
    if ((undefined1  [8])iStack_1b0._M_current != local_1b8) {
      bVar3 = executeFunctionalTest(this,(_variables *)local_1b8);
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar3);
      if ((undefined1  [8])iStack_1b0._M_current != local_1b8) {
        iStack_1b0._M_current = (_variable *)local_1b8;
      }
    }
    iVar9 = 0;
    if (uVar8 == 0x1a) {
      pcVar7 = "Fail";
      if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
        pcVar7 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,pcVar7);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test7::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* Check the negative cases first */
	const Utils::_variable_type double_variable_types[] = {
		Utils::VARIABLE_TYPE_DOUBLE,  Utils::VARIABLE_TYPE_DVEC2, Utils::VARIABLE_TYPE_DVEC3,
		Utils::VARIABLE_TYPE_DVEC4,   Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3,
		Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2,
		Utils::VARIABLE_TYPE_DMAT3X4, Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2,
		Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const unsigned int n_double_variable_types = sizeof(double_variable_types) / sizeof(double_variable_types[0]);

	for (unsigned int n_double_variable_type = 0; n_double_variable_type < n_double_variable_types;
		 ++n_double_variable_type)
	{
		for (unsigned int array_size = 1; array_size < 3; ++array_size)
		{
			Utils::_variable_type variable_type = double_variable_types[n_double_variable_type];

			if (compileShader(m_fs_id, getCodeOfFragmentShaderWithDoublePrecisionOutput(variable_type, array_size)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "A fragment shader with double-precision output variable compiled successfully."
								   << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}

			if (compileShader(m_fs_id,
							  getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(variable_type, array_size)))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "A fragment shader with double-precision input variables lacking flat layout qualifier"
					   " compiled successfully."
					<< tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}
		}
	} /* for (all variable types) */

	/* Execute functional test. Split the run into as many iterations as necessary
	 * so that we do not exceed GL implementation's capabilities. */
	unsigned int n_tested_variables = 0;
	_variables   variables_to_test;

	while (n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
	{
		glw::GLint total_n_used_components = 0;

		/* Use as many variables as possible for the iterations. Do not exceed maximum amount
		 * of varying components that can be used for all shadr stages.
		 */
		while (total_n_used_components < m_n_max_components_per_stage &&
			   n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
		{
			_variable	new_variable;
			unsigned int n_type_components = 0;
			glw::GLint   n_used_components = 0;

			new_variable.array_size =
				((n_tested_variables % 2) == 0) ? 1 /* non-arrayed variable */ : 2; /* arrayed variable */
			new_variable.type = double_variable_types[n_tested_variables / 2];

			/* Double-precision varyings can use twice as many components as single-precision FPs */
			n_type_components = 4 /* components per location */ *
								Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(new_variable.type);
			n_used_components = n_type_components * new_variable.array_size * 2;

			/* Do we have enough space? */
			if (total_n_used_components + n_used_components > m_n_max_components_per_stage)
			{
				if (n_used_components > m_n_max_components_per_stage)
				{ //if the number of components for this variable is larger than the max_components_per_stage, then skip it.
					n_tested_variables++;
				}
				break;
			}

			/* We can safely test the type in current iteration */
			total_n_used_components += n_used_components;
			n_tested_variables++;

			variables_to_test.push_back(new_variable);
		}

		if (variables_to_test.size() > 0)
		{
			m_has_test_passed &= executeFunctionalTest(variables_to_test);

			variables_to_test.clear();
		}
	}

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}